

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O0

result_type __thiscall
Well<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_Detail::M1,_Detail::M3<-15>,_Detail::M3<10>,_Detail::M3<-11>,_Detail::M3<16>,_Detail::M2<20>,_Detail::M1,_Detail::M3<-28>,_Detail::NoTempering>
::operator()(Well<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_Detail::M1,_Detail::M3<_15>,_Detail::M3<10>,_Detail::M3<_11>,_Detail::M3<16>,_Detail::M2<20>,_Detail::M1,_Detail::M3<_28>,_Detail::NoTempering>
             *this)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint x;
  uint uVar6;
  unsigned_long uVar7;
  uint z4;
  uint z3;
  uint z2;
  uint z1;
  uint z0;
  size_t im3;
  size_t im2;
  size_t im1;
  size_t l;
  size_t k;
  size_t j;
  size_t i;
  uint lower_mask;
  uint upper_mask;
  Well<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_Detail::M1,_Detail::M3<_15>,_Detail::M3<10>,_Detail::M3<_11>,_Detail::M3<16>,_Detail::M2<20>,_Detail::M1,_Detail::M3<_28>,_Detail::NoTempering>
  *this_local;
  
  sVar1 = this->index_;
  uVar7 = mod<unsigned_long>(sVar1 + 0x18);
  mod<unsigned_long>(sVar1 + 0x17);
  uVar6 = this->state_[uVar7];
  uVar2 = Detail::M1::transform<unsigned_int>(this->state_[sVar1]);
  uVar3 = state(this,sVar1 + 0xe);
  uVar3 = Detail::M3<-15>::transform<unsigned_int>(uVar3);
  uVar4 = state(this,sVar1 + 0x12);
  uVar4 = Detail::M3<10>::transform<unsigned_int>(uVar4);
  uVar5 = state(this,sVar1 + 0x11);
  uVar5 = Detail::M3<-11>::transform<unsigned_int>(uVar5);
  x = uVar2 ^ uVar3 ^ uVar4 ^ uVar5;
  uVar6 = Detail::M3<16>::transform<unsigned_int>(uVar6);
  uVar2 = Detail::M2<20>::transform<unsigned_int>(uVar2 ^ uVar3);
  uVar3 = Detail::M1::transform<unsigned_int>(uVar4 ^ uVar5);
  uVar4 = Detail::M3<-28>::transform<unsigned_int>(x);
  uVar4 = uVar6 ^ uVar2 ^ uVar3 ^ uVar4;
  this->state_[sVar1] = x;
  this->state_[uVar7] = uVar4;
  this->index_ = uVar7;
  uVar6 = Detail::NoTempering::apply<25ul,unsigned_int,25ul>(uVar4,this->state_,sVar1 + 0x12);
  return uVar6;
}

Assistant:

result_type operator()()
    {
        const UIntType upper_mask = ~0U << p;
        const UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        std::size_t i = index_;
        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        std::size_t j = i + r;
        std::size_t k = mod(j - 1); // [i,r-1]
        std::size_t l = mod(j - 2); // [i,r-2]

        std::size_t im1 = i + m1;
        std::size_t im2 = i + m2;
        std::size_t im3 = i + m3;

        UIntType z0, z1, z2, z3, z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state(im1));
        z2 = T2::transform(state(im2)) ^
             T3::transform(state(im3));
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<r>(z4, state_, im2);
    }